

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O1

exr_result_t internal_exr_parse_header(_internal_exr_context *ctxt)

{
  byte bVar1;
  exr_attr_preview_t *peVar2;
  undefined1 auVar3 [16];
  undefined8 __s1;
  exr_attr_chlist_t eVar4;
  exr_attribute_t **ppeVar5;
  _internal_exr_part *p_Var6;
  exr_result_t eVar7;
  exr_result_t eVar8;
  int iVar9;
  exr_attr_box2i_t *peVar10;
  uint uVar11;
  exr_storage_t eVar12;
  char *pcVar13;
  exr_attribute_t **ppeVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  uint8_t next_byte;
  uint8_t *outstr;
  _internal_exr_seq_scratch scratch;
  int32_t namelen;
  int32_t typelen;
  exr_attribute_t *nattr;
  _internal_exr_part *curpart;
  uint32_t flags;
  uint8_t *strptr;
  char type [256];
  char name [256];
  uint64_t initpos;
  uint8_t maxval;
  int32_t iVar19;
  byte local_2d5;
  int local_2d4;
  _internal_exr_part *local_2d0;
  exr_attr_chlist_t local_2c8;
  undefined1 local_2b0 [24];
  uint64_t local_298;
  _func_exr_result_t__internal_exr_seq_scratch_ptr_void_ptr_uint64_t *local_290;
  _func_exr_result_t__internal_exr_seq_scratch_ptr_uint64_t *local_288;
  _internal_exr_context *local_280;
  exr_attribute_t **local_278;
  int32_t local_26c;
  exr_attribute_list_t *local_268;
  int32_t local_25c;
  exr_attribute_t *local_258;
  _internal_exr_part *local_250;
  uint local_248;
  int32_t local_244;
  uint8_t *local_240;
  undefined4 local_238;
  short sStack_234;
  undefined1 uStack_232;
  undefined1 uStack_231;
  int local_230;
  byte local_138;
  char cStack_137;
  char cStack_136;
  char cStack_135;
  char cStack_134;
  char cStack_133;
  char cStack_132;
  char cStack_131;
  char cStack_130;
  char cStack_12f;
  char cStack_12e;
  char cStack_12d;
  char cStack_12c;
  char cStack_12b;
  char cStack_12a;
  char cStack_129;
  char cStack_128;
  char cStack_127;
  char cStack_126;
  uint64_t local_38;
  
  if (ctxt->silent_header != '\0') {
    ctxt->standard_error = silent_standard_error;
    ctxt->report_error = silent_error;
    ctxt->print_error = silent_print_error;
  }
  eVar7 = read_magic_and_flags(ctxt,&local_248,&local_38);
  if (eVar7 != 0) goto LAB_0011df27;
  local_2b0._8_16_ = (undefined1  [16])0x0;
  local_298 = local_38;
  local_290 = scratch_seq_read;
  local_288 = scratch_seq_skip;
  local_280 = ctxt;
  local_2b0._0_8_ = (*ctxt->alloc_fn)(0x1000);
  eVar7 = 0;
  if ((uint8_t *)local_2b0._0_8_ == (uint8_t *)0x0) {
    eVar7 = (*ctxt->standard_error)(ctxt,1);
  }
  if (eVar7 == 0) {
    local_250 = *ctxt->parts;
    if (local_250 == (_internal_exr_part *)0x0) {
      pcVar13 = "Error during file initialization";
      eVar7 = 3;
    }
    else {
      eVar12 = EXR_STORAGE_SCANLINE;
      uVar11 = local_248 >> 0xb;
      ctxt->is_singlepart_tiled = (byte)(local_248 >> 9) & 1;
      ctxt->max_name_length = -(ctxt->strict_header == '\0') | -((local_248 >> 10 & 1) != 0) | 0x1f;
      ctxt->has_nonimage_data = (byte)uVar11 & 1;
      ctxt->is_multipart = (byte)(local_248 >> 0xc) & 1;
      if (((local_248 >> 9 & 1) != 0) &&
         (eVar12 = EXR_STORAGE_TILED, (uVar11 & 1) != 0 || (local_248 >> 0xc & 1) != 0)) {
        if (ctxt->strict_header != '\0') {
          eVar7 = (*ctxt->print_error)
                            (ctxt,6,
                             "Invalid combination of version flags: single part found, but also marked as deep (%d) or multipart (%d)"
                             ,(ulong)(uVar11 & 1),(ulong)(local_248 >> 0xc & 1));
          goto LAB_0011df15;
        }
        ctxt->is_singlepart_tiled = '\0';
      }
      local_250->storage_mode = eVar12;
      eVar7 = (*local_290)((_internal_exr_seq_scratch *)local_2b0,&local_2d5,1);
      if (eVar7 == 0) {
LAB_0011df58:
        eVar7 = 0;
        if (local_2d5 == 0) {
          eVar7 = internal_exr_validate_read_part(ctxt,local_250);
          if (eVar7 != 0) goto LAB_0011df15;
          eVar7 = 0;
          if (ctxt->is_multipart != '\0') {
            eVar8 = (*local_290)((_internal_exr_seq_scratch *)local_2b0,&local_2d5,1);
            if (eVar8 == 0) {
              if (local_2d5 != 0) {
                eVar7 = internal_exr_add_part(ctxt,&local_250,(int *)0x0);
                goto LAB_0011dfbd;
              }
              goto LAB_0011f77c;
            }
            pcVar13 = "Unable to go to next part definition";
            goto LAB_0011df07;
          }
        }
        else {
LAB_0011dfbd:
          p_Var6 = local_250;
          if (eVar7 != 0) goto LAB_0011e066;
          local_25c = 0;
          local_2d4 = 0;
          local_258 = (exr_attribute_t *)0x0;
          local_240 = (uint8_t *)0x0;
          bVar1 = ctxt->max_name_length;
          local_138 = local_2d5;
          local_26c = 1;
          eVar7 = read_text(ctxt,(char *)&local_138,&local_26c,(uint)bVar1,
                            (_internal_exr_seq_scratch *)local_2b0,"attribute name");
          if (eVar7 != 0) goto LAB_0011e066;
          local_2d0 = p_Var6;
          eVar7 = read_text(ctxt,(char *)&local_238,&local_25c,(uint)bVar1,
                            (_internal_exr_seq_scratch *)local_2b0,"attribute type");
          if (eVar7 != 0) goto LAB_0011e066;
          if (local_26c == 0) {
            eVar7 = (*ctxt->report_error)
                              (ctxt,6,"Invalid empty string encountered parsing attribute name");
            goto LAB_0011e066;
          }
          if (local_25c == 0) {
            eVar7 = (*ctxt->print_error)
                              (ctxt,6,
                               "Invalid empty string encountered parsing attribute type for attribute \'%s\'"
                              );
            goto LAB_0011e066;
          }
          eVar7 = (*local_290)((_internal_exr_seq_scratch *)local_2b0,&local_2d4,4);
          iVar9 = local_2d4;
          if (eVar7 != 0) {
            eVar7 = (*ctxt->print_error)
                              (ctxt,eVar7,
                               "Unable to read attribute size for attribute \'%s\', type \'%s\'",
                               &local_138,&local_238);
            goto LAB_0011e066;
          }
          eVar7 = 0x20;
          if (local_138 - 99 < 0x14) {
            ppeVar14 = (exr_attribute_t **)(long)local_2d4;
            switch((uint)local_138) {
            case 99:
              if (cStack_130 == '\0' &&
                  CONCAT17(cStack_131,
                           CONCAT16(cStack_132,
                                    CONCAT15(cStack_133,
                                             CONCAT14(cStack_134,
                                                      CONCAT13(cStack_135,
                                                               CONCAT12(cStack_136,
                                                                        CONCAT11(cStack_137,
                                                                                 local_138))))))) ==
                  0x736c656e6e616863) {
                local_2c8.num_channels = 0;
                local_2c8.num_alloced = 0;
                local_2c8.entries = (exr_attr_chlist_entry_t *)0x0;
                if (local_2d0->channels == (exr_attribute_t *)0x0) {
                  if (CONCAT13(uStack_232,CONCAT21(sStack_234,local_238._3_1_)) != 0x747369 ||
                      local_238 != 0x696c6863) {
                    (*local_288)((_internal_exr_seq_scratch *)local_2b0,(uint64_t)ppeVar14);
                    pcVar13 = "Required attribute \'channels\': Invalid type \'%s\'";
                    goto LAB_0011ecb8;
                  }
                  eVar7 = extract_attr_chlist(ctxt,(_internal_exr_seq_scratch *)local_2b0,&local_2c8
                                              ,"channels",(char *)&local_238,local_2d4);
                  if (eVar7 == 0) {
                    ppeVar14 = &local_2d0->channels;
                    eVar7 = exr_attr_list_add_static_name
                                      ((exr_context_t)ctxt,&local_2d0->attributes,"channels",
                                       EXR_ATTR_CHLIST,0,(uint8_t **)0x0,ppeVar14);
                    if (eVar7 != 0) {
                      exr_attr_chlist_destroy((exr_context_t)ctxt,&local_2c8);
                      pcVar13 = "Unable to initialize attribute \'%s\', type \'chlist\'";
                      goto LAB_0011ecc0;
                    }
                    exr_attr_chlist_destroy((exr_context_t)ctxt,((*ppeVar14)->field_6).chlist);
                    eVar4 = local_2c8;
                    peVar2 = ((*ppeVar14)->field_6).preview;
                    peVar2->width = local_2c8.num_channels;
                    peVar2->height = local_2c8.num_alloced;
                    peVar2->alloc_size = (size_t)local_2c8.entries;
                    local_2c8 = eVar4;
LAB_0011f66a:
                    eVar7 = 0;
                  }
                  else {
                    exr_attr_chlist_destroy((exr_context_t)ctxt,&local_2c8);
                  }
                }
                else {
                  (*local_288)((_internal_exr_seq_scratch *)local_2b0,(uint64_t)ppeVar14);
                  pcVar13 = "Duplicate copy of required attribute \'channels\' encountered";
LAB_0011e63e:
                  eVar7 = (*ctxt->print_error)(ctxt,0xe,pcVar13);
                }
              }
              else {
                if (CONCAT13(cStack_12d,CONCAT12(cStack_12e,CONCAT11(cStack_12f,cStack_130))) ==
                    0x6e6f69 &&
                    CONCAT17(cStack_131,
                             CONCAT16(cStack_132,
                                      CONCAT15(cStack_133,
                                               CONCAT14(cStack_134,
                                                        CONCAT13(cStack_135,
                                                                 CONCAT12(cStack_136,
                                                                          CONCAT11(cStack_137,
                                                                                   local_138)))))))
                    == 0x73736572706d6f63) {
                  if (local_2d0->compression == (exr_attribute_t *)0x0) {
                    if (local_230 != 0x6e6f69 ||
                        CONCAT17(uStack_231,CONCAT16(uStack_232,CONCAT24(sStack_234,local_238))) !=
                        0x73736572706d6f63) {
                      (*local_288)((_internal_exr_seq_scratch *)local_2b0,(uint64_t)ppeVar14);
                      goto LAB_0011e972;
                    }
                    eVar7 = extract_attr_uint8(ctxt,(_internal_exr_seq_scratch *)local_2b0,
                                               (uint8_t *)&local_2c8,"compression",
                                               (char *)&local_238,local_2d4,'\n');
                    if (eVar7 != 0) break;
                    eVar7 = exr_attr_list_add_static_name
                                      ((exr_context_t)ctxt,&local_2d0->attributes,"compression",
                                       EXR_ATTR_COMPRESSION,0,(uint8_t **)0x0,
                                       &local_2d0->compression);
                    if (eVar7 == 0) {
                      (local_2d0->compression->field_6).uc = (byte)local_2c8.num_channels;
                      local_2d0->comp_type = (uint)(byte)local_2c8.num_channels;
                      goto LAB_0011f66a;
                    }
                    pcVar13 = "Unable to initialize attribute \'%s\', type \'compression\'";
                  }
                  else {
                    (*local_288)((_internal_exr_seq_scratch *)local_2b0,(uint64_t)ppeVar14);
                    eVar7 = 0xe;
                    pcVar13 = "Duplicate copy of required attribute \'%s\' encountered";
                  }
                  goto LAB_0011ecc0;
                }
                if (CONCAT17(cStack_12e,
                             CONCAT16(cStack_12f,
                                      CONCAT15(cStack_130,
                                               CONCAT14(cStack_131,
                                                        CONCAT13(cStack_132,
                                                                 CONCAT12(cStack_133,
                                                                          CONCAT11(cStack_134,
                                                                                   cStack_135)))))))
                    == 0x746e756f436b6e &&
                    CONCAT17(cStack_131,
                             CONCAT16(cStack_132,
                                      CONCAT15(cStack_133,
                                               CONCAT14(cStack_134,
                                                        CONCAT13(cStack_135,
                                                                 CONCAT12(cStack_136,
                                                                          CONCAT11(cStack_137,
                                                                                   local_138)))))))
                    == 0x756f436b6e756863) {
                  eVar7 = check_populate_chunk_count
                                    (ctxt,local_2d0,(_internal_exr_seq_scratch *)local_2b0,
                                     (char *)&local_238,local_2d4);
                }
              }
              break;
            case 100:
              if (CONCAT17(cStack_12e,
                           CONCAT16(cStack_12f,
                                    CONCAT15(cStack_130,
                                             CONCAT14(cStack_131,
                                                      CONCAT13(cStack_132,
                                                               CONCAT12(cStack_133,
                                                                        CONCAT11(cStack_134,
                                                                                 cStack_135)))))))
                  == 0x776f646e695761 &&
                  CONCAT17(cStack_131,
                           CONCAT16(cStack_132,
                                    CONCAT15(cStack_133,
                                             CONCAT14(cStack_134,
                                                      CONCAT13(cStack_135,
                                                               CONCAT12(cStack_136,
                                                                        CONCAT11(cStack_137,
                                                                                 local_138))))))) ==
                  0x646e695761746164) {
                local_2c8.num_channels = 0;
                local_2c8.num_alloced = 0;
                local_2c8.entries = (exr_attr_chlist_entry_t *)0x0;
                if (local_2d0->dataWindow != (exr_attribute_t *)0x0) {
                  (*local_288)((_internal_exr_seq_scratch *)local_2b0,(uint64_t)ppeVar14);
                  eVar7 = 0xe;
                  pcVar13 = "Duplicate copy of required attribute \'%s\' encountered";
                  goto LAB_0011ecc0;
                }
                if (sStack_234 != 0x69 || local_238 != 0x32786f62) {
                  (*local_288)((_internal_exr_seq_scratch *)local_2b0,(uint64_t)ppeVar14);
                  goto LAB_0011e972;
                }
                eVar7 = extract_attr_32bit(ctxt,(_internal_exr_seq_scratch *)local_2b0,&local_2c8,
                                           "dataWindow",(char *)&local_238,local_2d4,4);
                if (eVar7 == 0) {
                  eVar7 = exr_attr_list_add_static_name
                                    ((exr_context_t)ctxt,&local_2d0->attributes,"dataWindow",
                                     EXR_ATTR_BOX2I,0,(uint8_t **)0x0,&local_2d0->dataWindow);
                  if (eVar7 != 0) {
                    pcVar13 = "Unable to initialize attribute \'%s\', type \'box2i\'";
                    goto LAB_0011eab7;
                  }
                  peVar10 = (local_2d0->dataWindow->field_6).box2i;
                  (peVar10->min).field_0 =
                       (anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0)local_2c8._0_8_;
                  (peVar10->max).field_0 =
                       (anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0)local_2c8.entries;
                  (local_2d0->data_window).min.field_0 =
                       (anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0)local_2c8._0_8_;
                  (local_2d0->data_window).max.field_0 =
                       (anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0)local_2c8.entries;
LAB_0011f4bb:
                  eVar7 = 0;
                }
              }
              else if (CONCAT17(cStack_12b,
                                CONCAT16(cStack_12c,
                                         CONCAT15(cStack_12d,
                                                  CONCAT14(cStack_12e,
                                                           CONCAT13(cStack_12f,
                                                                    CONCAT12(cStack_130,
                                                                             CONCAT11(cStack_131,
                                                                                      cStack_132))))
                                                 ))) == 0x776f646e695779 &&
                       CONCAT17(cStack_131,
                                CONCAT16(cStack_132,
                                         CONCAT15(cStack_133,
                                                  CONCAT14(cStack_134,
                                                           CONCAT13(cStack_135,
                                                                    CONCAT12(cStack_136,
                                                                             CONCAT11(cStack_137,
                                                                                      local_138)))))
                                        )) == 0x5779616c70736964) {
                local_2c8.num_channels = 0;
                local_2c8.num_alloced = 0;
                local_2c8.entries = (exr_attr_chlist_entry_t *)0x0;
                if (local_2d0->displayWindow == (exr_attribute_t *)0x0) {
                  if (sStack_234 != 0x69 || local_238 != 0x32786f62) {
                    (*local_288)((_internal_exr_seq_scratch *)local_2b0,(uint64_t)ppeVar14);
                    goto LAB_0011e972;
                  }
                  eVar7 = extract_attr_32bit(ctxt,(_internal_exr_seq_scratch *)local_2b0,&local_2c8,
                                             "displayWindow",(char *)&local_238,local_2d4,4);
                  if (eVar7 != 0) break;
                  eVar7 = exr_attr_list_add_static_name
                                    ((exr_context_t)ctxt,&local_2d0->attributes,"displayWindow",
                                     EXR_ATTR_BOX2I,0,(uint8_t **)0x0,&local_2d0->displayWindow);
                  if (eVar7 == 0) {
                    peVar10 = (local_2d0->displayWindow->field_6).box2i;
                    (peVar10->min).field_0 =
                         (anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0)local_2c8._0_8_;
                    (peVar10->max).field_0 =
                         (anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0)local_2c8.entries;
                    (local_2d0->display_window).min.field_0 =
                         (anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0)local_2c8._0_8_;
                    (local_2d0->display_window).max.field_0 =
                         (anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0)local_2c8.entries;
                    goto LAB_0011f66a;
                  }
                  pcVar13 = "Unable to initialize attribute \'%s\', type \'box2i\'";
                }
                else {
                  (*local_288)((_internal_exr_seq_scratch *)local_2b0,(uint64_t)ppeVar14);
                  eVar7 = 0xe;
                  pcVar13 = "Duplicate copy of required attribute \'%s\' encountered";
                }
LAB_0011ecc0:
                eVar7 = (*ctxt->print_error)(ctxt,eVar7,pcVar13);
              }
              break;
            case 0x6c:
              if (CONCAT11(cStack_12f,cStack_130) == 0x72 &&
                  CONCAT17(cStack_131,
                           CONCAT16(cStack_132,
                                    CONCAT15(cStack_133,
                                             CONCAT14(cStack_134,
                                                      CONCAT13(cStack_135,
                                                               CONCAT12(cStack_136,
                                                                        CONCAT11(cStack_137,
                                                                                 local_138))))))) ==
                  0x6564724f656e696c) {
                if (local_2d0->lineOrder != (exr_attribute_t *)0x0) {
                  (*local_288)((_internal_exr_seq_scratch *)local_2b0,(uint64_t)ppeVar14);
                  eVar7 = 0xe;
                  pcVar13 = "Duplicate copy of required attribute \'%s\' encountered";
                  goto LAB_0011ecc0;
                }
                if ((short)local_230 != 0x72 ||
                    CONCAT17(uStack_231,CONCAT16(uStack_232,CONCAT24(sStack_234,local_238))) !=
                    0x6564724f656e696c) {
                  (*local_288)((_internal_exr_seq_scratch *)local_2b0,(uint64_t)ppeVar14);
                  goto LAB_0011e972;
                }
                eVar7 = extract_attr_uint8(ctxt,(_internal_exr_seq_scratch *)local_2b0,
                                           (uint8_t *)&local_2c8,"lineOrder",(char *)&local_238,
                                           local_2d4,'\x03');
                if (eVar7 == 0) {
                  eVar7 = exr_attr_list_add_static_name
                                    ((exr_context_t)ctxt,&local_2d0->attributes,"lineOrder",
                                     EXR_ATTR_LINEORDER,0,(uint8_t **)0x0,&local_2d0->lineOrder);
                  if (eVar7 == 0) {
                    (local_2d0->lineOrder->field_6).uc = (byte)local_2c8.num_channels;
                    local_2d0->lineorder = (uint)(byte)local_2c8.num_channels;
                    goto LAB_0011f4bb;
                  }
                  pcVar13 = "Unable to initialize attribute \'%s\', type \'lineOrder\'";
LAB_0011eab7:
                  eVar7 = (*ctxt->print_error)(ctxt,eVar7,pcVar13);
                }
              }
              break;
            case 0x6e:
              if ((cStack_134 == '\0' &&
                   CONCAT13(cStack_135,CONCAT12(cStack_136,CONCAT11(cStack_137,local_138))) ==
                   0x656d616e) &&
                 (local_278 = ppeVar14,
                 eVar7 = check_bad_attrsz(ctxt,(_internal_exr_seq_scratch *)local_2b0,local_2d4,1,
                                          "name",(char *)&local_238,&local_244), eVar7 == 0)) {
                if (local_2d0->name == (exr_attribute_t *)0x0) {
                  if (CONCAT13(uStack_232,CONCAT21(sStack_234,local_238._3_1_)) != 0x676e69 ||
                      local_238 != 0x69727473) {
                    (*local_288)((_internal_exr_seq_scratch *)local_2b0,(uint64_t)local_278);
                    pcVar13 = "attribute \'name\': Invalid type \'%s\'";
                    goto LAB_0011ecb8;
                  }
                  ppeVar14 = &local_2d0->name;
                  local_268 = &local_2d0->attributes;
                  eVar7 = exr_attr_list_add_static_name
                                    ((exr_context_t)ctxt,local_268,"name",EXR_ATTR_STRING,iVar9 + 1,
                                     (uint8_t **)&local_2c8,ppeVar14);
                  if (eVar7 != 0) {
                    (*local_288)((_internal_exr_seq_scratch *)local_2b0,(uint64_t)local_278);
                    pcVar13 = "Unable to initialize attribute \'%s\', type \'string\'";
                    goto LAB_0011ecc0;
                  }
                  eVar7 = (*local_290)((_internal_exr_seq_scratch *)local_2b0,
                                       (void *)local_2c8._0_8_,(uint64_t)local_278);
                  if (eVar7 == 0) {
                    *(char *)(local_2c8._0_8_ + (long)local_278) = '\0';
                    eVar7 = exr_attr_string_init_static_with_length
                                      ((exr_context_t)ctxt,((*ppeVar14)->field_6).string,
                                       (char *)local_2c8._0_8_,iVar9);
                    if (eVar7 == 0) goto LAB_0011f66a;
                  }
LAB_0011f532:
                  exr_attr_list_remove((exr_context_t)ctxt,local_268,*ppeVar14);
                  *ppeVar14 = (exr_attribute_t *)0x0;
LAB_0011f61e:
                  pcVar13 = "Unable to read \'name\' data";
LAB_0011f625:
                  eVar7 = (*ctxt->report_error)(ctxt,eVar7,pcVar13);
                }
                else {
                  (*local_288)((_internal_exr_seq_scratch *)local_2b0,(uint64_t)local_278);
                  pcVar13 = "Duplicate copy of required attribute \'name\' encountered";
LAB_0011e4ee:
                  eVar7 = (*ctxt->print_error)(ctxt,0xe,pcVar13);
                }
              }
              break;
            case 0x70:
              if ((cStack_128 == '\0' &&
                  CONCAT17(cStack_131,
                           CONCAT16(cStack_132,
                                    CONCAT15(cStack_133,
                                             CONCAT14(cStack_134,
                                                      CONCAT13(cStack_135,
                                                               CONCAT12(cStack_136,
                                                                        CONCAT11(cStack_137,
                                                                                 local_138))))))) ==
                  0x7073416c65786970) &&
                  CONCAT17(cStack_129,
                           CONCAT16(cStack_12a,
                                    CONCAT15(cStack_12b,
                                             CONCAT14(cStack_12c,
                                                      CONCAT13(cStack_12d,
                                                               CONCAT12(cStack_12e,
                                                                        CONCAT11(cStack_12f,
                                                                                 cStack_130)))))))
                  == 0x6f69746152746365) {
                if (local_2d0->pixelAspectRatio == (exr_attribute_t *)0x0) {
                  if (sStack_234 == 0x74 && local_238 == 0x616f6c66) {
                    if (local_2d4 == 4) {
                      eVar7 = (*local_290)((_internal_exr_seq_scratch *)local_2b0,&local_2c8,4);
                      if (eVar7 == 0) {
                        ppeVar14 = &local_2d0->pixelAspectRatio;
                        eVar7 = exr_attr_list_add_static_name
                                          ((exr_context_t)ctxt,&local_2d0->attributes,
                                           "pixelAspectRatio",EXR_ATTR_FLOAT,0,(uint8_t **)0x0,
                                           ppeVar14);
                        if (eVar7 == 0) {
LAB_0011f598:
                          ((*ppeVar14)->field_6).i = local_2c8.num_channels;
                          goto LAB_0011f66a;
                        }
                        pcVar13 = "Unable to initialize attribute \'%s\', type \'float\'";
                        goto LAB_0011ecc0;
                      }
                      pcVar13 = "Attribute \'%s\': Unable to read data (%d bytes)";
                    }
                    else {
                      (*local_288)((_internal_exr_seq_scratch *)local_2b0,(uint64_t)ppeVar14);
                      eVar7 = 0x11;
                      pcVar13 = "Required attribute \'%s\': Invalid size %d (exp 4)";
                    }
                    goto LAB_0011f314;
                  }
                  (*local_288)((_internal_exr_seq_scratch *)local_2b0,(uint64_t)ppeVar14);
LAB_0011e972:
                  eVar7 = (*ctxt->print_error)
                                    (ctxt,0x10,"Required attribute \'%s\': Invalid type \'%s\'");
                }
                else {
                  (*local_288)((_internal_exr_seq_scratch *)local_2b0,(uint64_t)ppeVar14);
LAB_0011e592:
                  eVar7 = (*ctxt->print_error)
                                    (ctxt,0xe,
                                     "Duplicate copy of required attribute \'%s\' encountered");
                }
              }
              break;
            case 0x73:
              auVar15[0] = -(cStack_135 == 'e');
              auVar15[1] = -(cStack_134 == 'e');
              auVar15[2] = -(cStack_133 == 'n');
              auVar15[3] = -(cStack_132 == 'W');
              auVar15[4] = -(cStack_131 == 'i');
              auVar15[5] = -(cStack_130 == 'n');
              auVar15[6] = -(cStack_12f == 'd');
              auVar15[7] = -(cStack_12e == 'o');
              auVar15[8] = -(cStack_12d == 'w');
              auVar15[9] = -(cStack_12c == 'C');
              auVar15[10] = -(cStack_12b == 'e');
              auVar15[0xb] = -(cStack_12a == 'n');
              auVar15[0xc] = -(cStack_129 == 't');
              auVar15[0xd] = -(cStack_128 == 'e');
              auVar15[0xe] = -(cStack_127 == 'r');
              auVar15[0xf] = -(cStack_126 == '\0');
              auVar17[0] = -(local_138 == 's');
              auVar17[1] = -(cStack_137 == 'c');
              auVar17[2] = -(cStack_136 == 'r');
              auVar17[3] = -(cStack_135 == 'e');
              auVar17[4] = -(cStack_134 == 'e');
              auVar17[5] = -(cStack_133 == 'n');
              auVar17[6] = -(cStack_132 == 'W');
              auVar17[7] = -(cStack_131 == 'i');
              auVar17[8] = -(cStack_130 == 'n');
              auVar17[9] = -(cStack_12f == 'd');
              auVar17[10] = -(cStack_12e == 'o');
              auVar17[0xb] = -(cStack_12d == 'w');
              auVar17[0xc] = -(cStack_12c == 'C');
              auVar17[0xd] = -(cStack_12b == 'e');
              auVar17[0xe] = -(cStack_12a == 'n');
              auVar17[0xf] = -(cStack_129 == 't');
              auVar17 = auVar17 & auVar15;
              if ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) == 0xffff) {
                if (local_2d0->screenWindowCenter != (exr_attribute_t *)0x0) {
                  (*local_288)((_internal_exr_seq_scratch *)local_2b0,(uint64_t)ppeVar14);
                  goto LAB_0011e592;
                }
                if (local_238 != 0x663276) {
                  (*local_288)((_internal_exr_seq_scratch *)local_2b0,(uint64_t)ppeVar14);
                  goto LAB_0011e972;
                }
                if (local_2d4 == 8) {
                  eVar7 = (*local_290)((_internal_exr_seq_scratch *)local_2b0,&local_2c8,8);
                  if (eVar7 != 0) {
                    pcVar13 = "Attribute \'%s\': Unable to read data (%d bytes)";
                    goto LAB_0011f314;
                  }
                  ppeVar14 = &local_2d0->screenWindowCenter;
                  eVar7 = exr_attr_list_add_static_name
                                    ((exr_context_t)ctxt,&local_2d0->attributes,"screenWindowCenter"
                                     ,EXR_ATTR_V2F,0,(uint8_t **)0x0,ppeVar14);
                  if (eVar7 == 0) {
                    peVar10 = ((*ppeVar14)->field_6).box2i;
LAB_0011f655:
                    (peVar10->min).field_0 =
                         (anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0)local_2c8._0_8_;
                    goto LAB_0011f66a;
                  }
                  pcVar13 = "Unable to initialize attribute \'%s\', type \'v2f\'";
                  goto LAB_0011ecc0;
                }
                (*local_288)((_internal_exr_seq_scratch *)local_2b0,(uint64_t)ppeVar14);
                eVar7 = (*ctxt->print_error)
                                  (ctxt,0x11,"Required attribute \'%s\': Invalid size %d (exp %lu)")
                ;
              }
              else {
                auVar16[0] = -(cStack_128 == 'h');
                auVar16[1] = -(cStack_127 == '\0');
                auVar16[2] = 0xff;
                auVar16[3] = 0xff;
                auVar16[4] = 0xff;
                auVar16[5] = 0xff;
                auVar16[6] = 0xff;
                auVar16[7] = 0xff;
                auVar16[8] = 0xff;
                auVar16[9] = 0xff;
                auVar16[10] = 0xff;
                auVar16[0xb] = 0xff;
                auVar16[0xc] = 0xff;
                auVar16[0xd] = 0xff;
                auVar16[0xe] = 0xff;
                auVar16[0xf] = 0xff;
                auVar18[0] = -(local_138 == 's');
                auVar18[1] = -(cStack_137 == 'c');
                auVar18[2] = -(cStack_136 == 'r');
                auVar18[3] = -(cStack_135 == 'e');
                auVar18[4] = -(cStack_134 == 'e');
                auVar18[5] = -(cStack_133 == 'n');
                auVar18[6] = -(cStack_132 == 'W');
                auVar18[7] = -(cStack_131 == 'i');
                auVar18[8] = -(cStack_130 == 'n');
                auVar18[9] = -(cStack_12f == 'd');
                auVar18[10] = -(cStack_12e == 'o');
                auVar18[0xb] = -(cStack_12d == 'w');
                auVar18[0xc] = -(cStack_12c == 'W');
                auVar18[0xd] = -(cStack_12b == 'i');
                auVar18[0xe] = -(cStack_12a == 'd');
                auVar18[0xf] = -(cStack_129 == 't');
                auVar18 = auVar18 & auVar16;
                if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) == 0xffff) {
                  if (local_2d0->screenWindowWidth != (exr_attribute_t *)0x0) {
                    (*local_288)((_internal_exr_seq_scratch *)local_2b0,(uint64_t)ppeVar14);
                    eVar7 = 0xe;
                    pcVar13 = "Duplicate copy of required attribute \'%s\' encountered";
                    goto LAB_0011ecc0;
                  }
                  if (sStack_234 != 0x74 || local_238 != 0x616f6c66) {
                    (*local_288)((_internal_exr_seq_scratch *)local_2b0,(uint64_t)ppeVar14);
                    goto LAB_0011e972;
                  }
                  if (local_2d4 == 4) {
                    eVar7 = (*local_290)((_internal_exr_seq_scratch *)local_2b0,&local_2c8,4);
                    if (eVar7 == 0) {
                      ppeVar14 = &local_2d0->screenWindowWidth;
                      eVar7 = exr_attr_list_add_static_name
                                        ((exr_context_t)ctxt,&local_2d0->attributes,
                                         "screenWindowWidth",EXR_ATTR_FLOAT,0,(uint8_t **)0x0,
                                         ppeVar14);
                      if (eVar7 == 0) goto LAB_0011f598;
                      pcVar13 = "Unable to initialize attribute \'%s\', type \'float\'";
                      goto LAB_0011ecc0;
                    }
                    pcVar13 = "Attribute \'%s\': Unable to read data (%d bytes)";
                  }
                  else {
                    (*local_288)((_internal_exr_seq_scratch *)local_2b0,(uint64_t)ppeVar14);
                    eVar7 = 0x11;
                    pcVar13 = "Required attribute \'%s\': Invalid size %d (exp 4)";
                  }
LAB_0011f314:
                  eVar7 = (*ctxt->print_error)(ctxt,eVar7,pcVar13);
                }
              }
              break;
            case 0x74:
              if (CONCAT11(cStack_133,cStack_134) == 0x73 &&
                  CONCAT13(cStack_135,CONCAT12(cStack_136,CONCAT11(cStack_137,local_138))) ==
                  0x656c6974) {
                local_2c8.entries._0_1_ = 0;
                auVar3._8_8_ = 0;
                auVar3._0_8_ = local_2c8.entries;
                local_2c8 = (exr_attr_chlist_t)(auVar3 << 0x40);
                if (local_2d0->tiles != (exr_attribute_t *)0x0) {
                  (*local_288)((_internal_exr_seq_scratch *)local_2b0,(uint64_t)ppeVar14);
                  pcVar13 = "Duplicate copy of required attribute \'tiles\' encountered";
                  goto LAB_0011e63e;
                }
                if ((char)local_230 != '\0' ||
                    CONCAT17(uStack_231,CONCAT16(uStack_232,CONCAT24(sStack_234,local_238))) !=
                    0x63736564656c6974) {
                  (*local_288)((_internal_exr_seq_scratch *)local_2b0,(uint64_t)ppeVar14);
                  pcVar13 = "Required attribute \'tiles\': Invalid type \'%s\'";
                  goto LAB_0011ecb8;
                }
                if (local_2d4 == 9) {
                  eVar7 = (*local_290)((_internal_exr_seq_scratch *)local_2b0,&local_2c8,9);
                  if (eVar7 != 0) {
                    pcVar13 = "Unable to read \'tiles\' data";
                    goto LAB_0011f625;
                  }
                  ppeVar14 = &local_2d0->tiles;
                  eVar7 = exr_attr_list_add_static_name
                                    ((exr_context_t)ctxt,&local_2d0->attributes,"tiles",
                                     EXR_ATTR_TILEDESC,0,(uint8_t **)0x0,ppeVar14);
                  if (eVar7 == 0) {
                    peVar10 = (exr_attr_box2i_t *)((*ppeVar14)->field_6).tiledesc;
                    *(undefined1 *)&(peVar10->max).field_0 = local_2c8.entries._0_1_;
                    goto LAB_0011f655;
                  }
                  pcVar13 = "Unable to initialize attribute \'%s\', type \'tiledesc\'";
                  goto LAB_0011ecc0;
                }
                (*local_288)((_internal_exr_seq_scratch *)local_2b0,(uint64_t)ppeVar14);
                eVar7 = (*ctxt->print_error)
                                  (ctxt,0x10,
                                   "Required attribute \'tiles\': Invalid size %d (exp %lu)");
              }
              else if ((cStack_134 == '\0' &&
                        CONCAT13(cStack_135,CONCAT12(cStack_136,CONCAT11(cStack_137,local_138))) ==
                        0x65707974) &&
                      (eVar7 = check_bad_attrsz(ctxt,(_internal_exr_seq_scratch *)local_2b0,
                                                local_2d4,1,"type",(char *)&local_238,&local_244),
                      eVar7 == 0)) {
                if (local_2d0->type != (exr_attribute_t *)0x0) {
                  (*local_288)((_internal_exr_seq_scratch *)local_2b0,(uint64_t)ppeVar14);
                  pcVar13 = "Duplicate copy of required attribute \'type\' encountered";
                  goto LAB_0011e4ee;
                }
                if (CONCAT13(uStack_232,CONCAT21(sStack_234,local_238._3_1_)) == 0x676e69 &&
                    local_238 == 0x69727473) {
                  local_278 = &local_2d0->type;
                  local_268 = &local_2d0->attributes;
                  eVar7 = exr_attr_list_add_static_name
                                    ((exr_context_t)ctxt,local_268,"type",EXR_ATTR_STRING,iVar9 + 1,
                                     (uint8_t **)&local_2c8,local_278);
                  if (eVar7 == 0) {
                    eVar7 = (*local_290)((_internal_exr_seq_scratch *)local_2b0,
                                         (void *)local_2c8._0_8_,(uint64_t)ppeVar14);
                    ppeVar5 = local_278;
                    if (eVar7 != 0) {
                      exr_attr_list_remove((exr_context_t)ctxt,local_268,*local_278);
                      *ppeVar5 = (exr_attribute_t *)0x0;
                      goto LAB_0011f61e;
                    }
                    *(char *)(local_2c8._0_8_ + (long)ppeVar14) = '\0';
                    eVar7 = exr_attr_string_init_static_with_length
                                      ((exr_context_t)ctxt,((*local_278)->field_6).string,
                                       (char *)local_2c8._0_8_,iVar9);
                    ppeVar14 = local_278;
                    if (eVar7 != 0) goto LAB_0011f532;
                    __s1 = local_2c8._0_8_;
                    iVar9 = strcmp((char *)local_2c8._0_8_,"scanlineimage");
                    if (iVar9 == 0) {
                      local_2d0->storage_mode = EXR_STORAGE_SCANLINE;
                    }
                    else {
                      iVar9 = strcmp((char *)__s1,"tiledimage");
                      if (iVar9 == 0) {
                        local_2d0->storage_mode = EXR_STORAGE_TILED;
                      }
                      else {
                        iVar9 = strcmp((char *)__s1,"deepscanline");
                        if (iVar9 == 0) {
                          local_2d0->storage_mode = EXR_STORAGE_DEEP_SCANLINE;
                        }
                        else {
                          iVar9 = strcmp((char *)__s1,"deeptile");
                          if (iVar9 != 0) {
                            eVar7 = (*ctxt->print_error)
                                              (ctxt,0xe,
                                               "attribute \'type\': Invalid type string \'%s\'");
                            ppeVar14 = local_278;
                            exr_attr_list_remove((exr_context_t)ctxt,local_268,*local_278);
                            *ppeVar14 = (exr_attribute_t *)0x0;
                            break;
                          }
                          local_2d0->storage_mode = EXR_STORAGE_DEEP_TILED;
                        }
                      }
                    }
                    goto LAB_0011f66a;
                  }
                  (*local_288)((_internal_exr_seq_scratch *)local_2b0,(uint64_t)ppeVar14);
                  pcVar13 = "Unable to initialize attribute \'%s\', type \'string\'";
                  goto LAB_0011ecc0;
                }
                (*local_288)((_internal_exr_seq_scratch *)local_2b0,(uint64_t)ppeVar14);
                pcVar13 = "Required attribute \'type\': Invalid type \'%s\'";
LAB_0011ecb8:
                eVar7 = 0x10;
                goto LAB_0011ecc0;
              }
              break;
            case 0x76:
              if (CONCAT17(cStack_131,
                           CONCAT16(cStack_132,
                                    CONCAT15(cStack_133,
                                             CONCAT14(cStack_134,
                                                      CONCAT13(cStack_135,
                                                               CONCAT12(cStack_136,
                                                                        CONCAT11(cStack_137,
                                                                                 local_138))))))) ==
                  0x6e6f6973726576) {
                local_2c8.num_channels = local_2d4;
                if (local_2d0->version != (exr_attribute_t *)0x0) {
                  (*local_288)((_internal_exr_seq_scratch *)local_2b0,(uint64_t)ppeVar14);
                  pcVar13 = "Duplicate copy of required attribute \'version\' encountered";
                  goto LAB_0011e63e;
                }
                if (local_238 != 0x746e69) {
                  (*local_288)((_internal_exr_seq_scratch *)local_2b0,(uint64_t)ppeVar14);
                  pcVar13 = "attribute \'version\': Invalid type \'%s\'";
                  goto LAB_0011ecb8;
                }
                if (local_2d4 == 4) {
                  eVar7 = (*local_290)((_internal_exr_seq_scratch *)local_2b0,&local_2c8,4);
                  if (eVar7 != 0) {
                    pcVar13 = "Unable to read version data";
                    goto LAB_0011f625;
                  }
                  if (local_2c8.num_channels == 1) {
                    ppeVar14 = &local_2d0->version;
                    eVar7 = exr_attr_list_add_static_name
                                      ((exr_context_t)ctxt,&local_2d0->attributes,"version",
                                       EXR_ATTR_INT,0,(uint8_t **)0x0,ppeVar14);
                    if (eVar7 == 0) {
                      ((*ppeVar14)->field_6).i = local_2c8.num_channels;
                      goto LAB_0011f66a;
                    }
                    pcVar13 = "Unable to initialize attribute \'%s\', type \'int\'";
                    goto LAB_0011ecc0;
                  }
                  pcVar13 = "Invalid version %d: expect 1";
                }
                else {
                  (*local_288)((_internal_exr_seq_scratch *)local_2b0,(uint64_t)ppeVar14);
                  pcVar13 = "attribute \'version\': Invalid size %d (exp 4)";
                }
                eVar7 = (*ctxt->print_error)(ctxt,0xe,pcVar13);
              }
            }
          }
          if (eVar7 != 0x20) goto LAB_0011e066;
          if (CONCAT13(uStack_232,CONCAT21(sStack_234,local_238._3_1_)) == 0x676e69 &&
              local_238 == 0x69727473) {
            eVar7 = check_bad_attrsz(ctxt,(_internal_exr_seq_scratch *)local_2b0,local_2d4,1,
                                     (char *)&local_138,(char *)&local_238,&local_2c8.num_channels);
            if (eVar7 != 0) goto LAB_0011e066;
            iVar9 = exr_attr_list_add((exr_context_t)ctxt,&local_2d0->attributes,(char *)&local_138,
                                      EXR_ATTR_STRING,local_2c8.num_channels + 1,&local_240,
                                      &local_258);
          }
          else {
            iVar9 = exr_attr_list_add_by_type
                              ((exr_context_t)ctxt,&local_2d0->attributes,(char *)&local_138,
                               (char *)&local_238,0,(uint8_t **)0x0,&local_258);
          }
          if (iVar9 != 0) {
            eVar7 = (*ctxt->print_error)
                              (ctxt,iVar9,"Unable to initialize attribute \'%s\', type \'%s\'",
                               &local_138,&local_238);
            goto LAB_0011e066;
          }
          switch(local_258->type) {
          case EXR_ATTR_BOX2I:
          case EXR_ATTR_BOX2F:
            peVar10 = (local_258->field_6).box2i;
            iVar19 = 4;
            goto LAB_0011f034;
          case EXR_ATTR_CHLIST:
            eVar7 = extract_attr_chlist(ctxt,(_internal_exr_seq_scratch *)local_2b0,
                                        (local_258->field_6).chlist,(char *)&local_138,
                                        (char *)&local_238,local_2d4);
            break;
          case EXR_ATTR_CHROMATICITIES:
            peVar10 = (local_258->field_6).box2i;
            iVar19 = 8;
            goto LAB_0011f034;
          case EXR_ATTR_COMPRESSION:
            maxval = '\n';
            goto LAB_0011efd6;
          case EXR_ATTR_DOUBLE:
            peVar10 = (exr_attr_box2i_t *)&local_258->field_6;
            iVar19 = 1;
            goto LAB_0011f005;
          case EXR_ATTR_ENVMAP:
            maxval = '\x02';
            goto LAB_0011efd6;
          case EXR_ATTR_FLOAT:
          case EXR_ATTR_INT:
            peVar10 = (exr_attr_box2i_t *)&local_258->field_6;
            iVar19 = 1;
            goto LAB_0011f034;
          case EXR_ATTR_FLOAT_VECTOR:
            eVar7 = extract_attr_float_vector
                              (ctxt,(_internal_exr_seq_scratch *)local_2b0,
                               (local_258->field_6).floatvector,(char *)&local_138,
                               (char *)&local_238,local_2d4);
            break;
          case EXR_ATTR_KEYCODE:
            peVar10 = (local_258->field_6).box2i;
            iVar19 = 7;
            goto LAB_0011f034;
          case EXR_ATTR_LINEORDER:
            maxval = '\x03';
LAB_0011efd6:
            eVar7 = extract_attr_uint8(ctxt,(_internal_exr_seq_scratch *)local_2b0,
                                       &(local_258->field_6).uc,(char *)&local_138,
                                       (char *)&local_238,local_2d4,maxval);
            break;
          case EXR_ATTR_M33F:
            peVar10 = (local_258->field_6).box2i;
            iVar19 = 9;
            goto LAB_0011f034;
          case EXR_ATTR_M33D:
            peVar10 = (local_258->field_6).box2i;
            iVar19 = 9;
            goto LAB_0011f005;
          case EXR_ATTR_M44F:
            peVar10 = (local_258->field_6).box2i;
            iVar19 = 0x10;
            goto LAB_0011f034;
          case EXR_ATTR_M44D:
            peVar10 = (local_258->field_6).box2i;
            iVar19 = 0x10;
            goto LAB_0011f005;
          case EXR_ATTR_PREVIEW:
            eVar7 = extract_attr_preview
                              (ctxt,(_internal_exr_seq_scratch *)local_2b0,
                               (local_258->field_6).preview,(char *)&local_138,(char *)&local_238,
                               local_2d4);
            break;
          case EXR_ATTR_RATIONAL:
          case EXR_ATTR_TIMECODE:
          case EXR_ATTR_V2I:
          case EXR_ATTR_V2F:
            peVar10 = (local_258->field_6).box2i;
            iVar19 = 2;
            goto LAB_0011f034;
          case EXR_ATTR_STRING:
            eVar7 = extract_attr_string(ctxt,(_internal_exr_seq_scratch *)local_2b0,
                                        (local_258->field_6).string,(char *)&local_138,
                                        (char *)&local_238,local_2d4,(char *)local_240);
            break;
          case EXR_ATTR_STRING_VECTOR:
            eVar7 = extract_attr_string_vector
                              (ctxt,(_internal_exr_seq_scratch *)local_2b0,
                               (local_258->field_6).stringvector,(char *)&local_138,
                               (char *)&local_238,local_2d4);
            break;
          case EXR_ATTR_TILEDESC:
            eVar7 = extract_attr_tiledesc
                              (ctxt,(_internal_exr_seq_scratch *)local_2b0,
                               (local_258->field_6).tiledesc,(char *)&local_138,(char *)&local_238,
                               local_2d4);
            break;
          case EXR_ATTR_V2D:
            peVar10 = (local_258->field_6).box2i;
            iVar19 = 2;
            goto LAB_0011f005;
          case EXR_ATTR_V3I:
          case EXR_ATTR_V3F:
            peVar10 = (local_258->field_6).box2i;
            iVar19 = 3;
LAB_0011f034:
            eVar7 = extract_attr_32bit(ctxt,(_internal_exr_seq_scratch *)local_2b0,peVar10,
                                       (char *)&local_138,(char *)&local_238,local_2d4,iVar19);
            break;
          case EXR_ATTR_V3D:
            peVar10 = (local_258->field_6).box2i;
            iVar19 = 3;
LAB_0011f005:
            eVar7 = extract_attr_64bit(ctxt,(_internal_exr_seq_scratch *)local_2b0,peVar10,
                                       (char *)&local_138,(char *)&local_238,local_2d4,iVar19);
            break;
          case EXR_ATTR_OPAQUE:
            eVar7 = extract_attr_opaque(ctxt,(_internal_exr_seq_scratch *)local_2b0,
                                        (local_258->field_6).opaque,(char *)&local_138,
                                        (char *)&local_238,local_2d4);
            break;
          default:
            eVar7 = (*ctxt->print_error)
                              (ctxt,3,"Invalid type \'%s\' for attribute \'%s\'",&local_238,
                               &local_138);
          }
          if (eVar7 != 0) {
            exr_attr_list_remove((exr_context_t)ctxt,&local_2d0->attributes,local_258);
          }
LAB_0011e066:
          if ((eVar7 == 0) || (ctxt->strict_header == '\0')) {
            eVar7 = (*local_290)((_internal_exr_seq_scratch *)local_2b0,&local_2d5,1);
            if (eVar7 != 0) goto LAB_0011df00;
            goto LAB_0011df58;
          }
        }
LAB_0011f77c:
        if (eVar7 == 0) {
          eVar7 = update_chunk_offsets(ctxt,(_internal_exr_seq_scratch *)local_2b0);
        }
        goto LAB_0011df15;
      }
LAB_0011df00:
      pcVar13 = "Unable to extract header byte";
LAB_0011df07:
      eVar7 = 6;
    }
    eVar7 = (*ctxt->report_error)(ctxt,eVar7,pcVar13);
  }
LAB_0011df15:
  if ((uint8_t *)local_2b0._0_8_ != (uint8_t *)0x0) {
    (*local_280->free_fn)((void *)local_2b0._0_8_);
  }
LAB_0011df27:
  eVar7 = internal_exr_context_restore_handlers(ctxt,eVar7);
  return eVar7;
}

Assistant:

exr_result_t
internal_exr_parse_header (struct _internal_exr_context* ctxt)
{
    struct _internal_exr_seq_scratch scratch;
    struct _internal_exr_part*       curpart;
    uint32_t                         flags;
    uint64_t                         initpos;
    uint8_t                          next_byte;
    exr_result_t                     rv = EXR_ERR_UNKNOWN;

    if (ctxt->silent_header)
    {
        ctxt->standard_error = &silent_standard_error;
        ctxt->report_error   = &silent_error;
        ctxt->print_error    = &silent_print_error;
    }
    rv = read_magic_and_flags (ctxt, &flags, &initpos);
    if (rv != EXR_ERR_SUCCESS)
        return internal_exr_context_restore_handlers (ctxt, rv);

    rv = priv_init_scratch (ctxt, &scratch, initpos);
    if (rv != EXR_ERR_SUCCESS)
    {
        priv_destroy_scratch (&scratch);
        return internal_exr_context_restore_handlers (ctxt, rv);
    }

    curpart = ctxt->parts[0];
    if (!curpart)
    {
        rv = ctxt->report_error (
            ctxt, EXR_ERR_INVALID_ARGUMENT, "Error during file initialization");
        priv_destroy_scratch (&scratch);
        return internal_exr_context_restore_handlers (ctxt, rv);
    }

    ctxt->is_singlepart_tiled = (flags & EXR_TILED_FLAG) ? 1 : 0;
    if (ctxt->strict_header)
    {
        ctxt->max_name_length = (flags & EXR_LONG_NAMES_FLAG)
                                    ? EXR_LONGNAME_MAXLEN
                                    : EXR_SHORTNAME_MAXLEN;
    }
    else
    {
        ctxt->max_name_length = EXR_LONGNAME_MAXLEN;
    }
    ctxt->has_nonimage_data = (flags & EXR_NON_IMAGE_FLAG) ? 1 : 0;
    ctxt->is_multipart      = (flags & EXR_MULTI_PART_FLAG) ? 1 : 0;
    if (ctxt->is_singlepart_tiled)
    {
        if (ctxt->has_nonimage_data || ctxt->is_multipart)
        {
            if (ctxt->strict_header)
            {
                rv = ctxt->print_error (
                    ctxt,
                    EXR_ERR_FILE_BAD_HEADER,
                    "Invalid combination of version flags: single part found, but also marked as deep (%d) or multipart (%d)",
                    (int) ctxt->has_nonimage_data,
                    (int) ctxt->is_multipart);
                priv_destroy_scratch (&scratch);
                return internal_exr_context_restore_handlers (ctxt, rv);
            }
            else
            {
                // assume multipart for now
                ctxt->is_singlepart_tiled = 0;
            }
        }
        curpart->storage_mode = EXR_STORAGE_TILED;
    }
    else
        curpart->storage_mode = EXR_STORAGE_SCANLINE;

    do
    {
        rv = scratch.sequential_read (&scratch, &next_byte, 1);
        if (rv != EXR_ERR_SUCCESS)
        {
            rv = ctxt->report_error (
                ctxt, EXR_ERR_FILE_BAD_HEADER, "Unable to extract header byte");
            priv_destroy_scratch (&scratch);
            return internal_exr_context_restore_handlers (ctxt, rv);
        }

        if (next_byte == '\0')
        {
            rv = internal_exr_validate_read_part (ctxt, curpart);
            if (rv != EXR_ERR_SUCCESS)
            {
                priv_destroy_scratch (&scratch);
                return internal_exr_context_restore_handlers (ctxt, rv);
            }

            if (!ctxt->is_multipart)
            {
                /* got a terminal mark, not multipart, so finished */
                break;
            }

            rv = scratch.sequential_read (&scratch, &next_byte, 1);
            if (rv != EXR_ERR_SUCCESS)
            {
                rv = ctxt->report_error (
                    ctxt,
                    EXR_ERR_FILE_BAD_HEADER,
                    "Unable to go to next part definition");
                priv_destroy_scratch (&scratch);
                return internal_exr_context_restore_handlers (ctxt, rv);
            }

            if (next_byte == '\0')
            {
                /* got a second terminator, finished with the
                 * headers, can read chunk offsets next */
                break;
            }

            rv = internal_exr_add_part (ctxt, &curpart, NULL);
        }

        if (rv == EXR_ERR_SUCCESS)
            rv = pull_attr (ctxt, curpart, next_byte, &scratch);
        if (rv != EXR_ERR_SUCCESS)
        {
            if (ctxt->strict_header) { break; }
            rv = EXR_ERR_SUCCESS;
        }
    } while (1);

    if (rv == EXR_ERR_SUCCESS) { rv = update_chunk_offsets (ctxt, &scratch); }

    priv_destroy_scratch (&scratch);
    return internal_exr_context_restore_handlers (ctxt, rv);
}